

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O3

int Fra_OneHotCount(Fra_Man_t *p,Vec_Int_t *vOneHots)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  iVar1 = vOneHots->nSize;
  iVar3 = 0;
  if (0 < (long)iVar1) {
    uVar4 = 1;
    do {
      if ((ulong)(long)iVar1 <= uVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = iVar3 + (uint)(vOneHots->pArray[uVar4] != 0 || vOneHots->pArray[uVar4 - 1] != 0);
      iVar2 = (int)uVar4;
      uVar4 = uVar4 + 2;
    } while (iVar2 + 1 < iVar1);
  }
  return iVar3;
}

Assistant:

int Fra_OneHotCount( Fra_Man_t * p, Vec_Int_t * vOneHots )
{
    int i, Out1, Out2, Counter = 0;
    for ( i = 0; i < Vec_IntSize(vOneHots); i += 2 )
    {
        Out1 = Vec_IntEntry( vOneHots, i );
        Out2 = Vec_IntEntry( vOneHots, i+1 );
        if ( Out1 == 0 && Out2 == 0 )
            continue;
        Counter++;
    }
    return Counter;
}